

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

nghttp2_outbound_item * nghttp2_session_get_next_ob_item(nghttp2_session *session)

{
  nghttp2_outbound_item *pnVar1;
  nghttp2_pq_entry *pnVar2;
  long lVar3;
  
  pnVar1 = (session->ob_urgent).head;
  if (((pnVar1 == (nghttp2_outbound_item *)0x0) &&
      (pnVar1 = (session->ob_reg).head, pnVar1 == (nghttp2_outbound_item *)0x0)) &&
     (((ulong)(session->remote_settings).max_concurrent_streams <= session->num_outgoing_streams ||
      (pnVar1 = (session->ob_syn).head, pnVar1 == (nghttp2_outbound_item *)0x0)))) {
    if (session->remote_window_size < 1) {
      pnVar1 = (nghttp2_outbound_item *)0x0;
    }
    else {
      pnVar1 = nghttp2_stream_next_outbound_item(&session->root);
      if (pnVar1 == (nghttp2_outbound_item *)0x0) {
        pnVar1 = (nghttp2_outbound_item *)0x0;
        lVar3 = 0;
        do {
          pnVar2 = nghttp2_pq_top((nghttp2_pq *)((long)&session->sched[0].ob_data.q + lVar3));
          if (pnVar2 != (nghttp2_pq_entry *)0x0) {
            return (nghttp2_outbound_item *)pnVar2[0x13].index;
          }
          lVar3 = lVar3 + 0x28;
        } while (lVar3 != 0x140);
      }
    }
  }
  return pnVar1;
}

Assistant:

nghttp2_outbound_item *
nghttp2_session_get_next_ob_item(nghttp2_session *session) {
  nghttp2_outbound_item *item;

  if (nghttp2_outbound_queue_top(&session->ob_urgent)) {
    return nghttp2_outbound_queue_top(&session->ob_urgent);
  }

  if (nghttp2_outbound_queue_top(&session->ob_reg)) {
    return nghttp2_outbound_queue_top(&session->ob_reg);
  }

  if (!session_is_outgoing_concurrent_streams_max(session)) {
    if (nghttp2_outbound_queue_top(&session->ob_syn)) {
      return nghttp2_outbound_queue_top(&session->ob_syn);
    }
  }

  if (session->remote_window_size > 0) {
    item = nghttp2_stream_next_outbound_item(&session->root);
    if (item) {
      return item;
    }

    return session_sched_get_next_outbound_item(session);
  }

  return NULL;
}